

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

err_t bignParamsVal(bign_params *params)

{
  bool_t bVar1;
  int iVar2;
  long *stack_00;
  u64 *dest;
  size_t sVar3;
  word *a;
  word *in_RDI;
  word *unaff_retaddr;
  void *stack;
  word *B;
  octet *seed;
  octet *hash_state;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  void *in_stack_ffffffffffffff88;
  bign_params *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  ec_o *stack_01;
  void *in_stack_ffffffffffffffa0;
  u64 *a_00;
  ec_o *ec_00;
  word *seed_00;
  bign_params *in_stack_ffffffffffffffc0;
  u64 *a_01;
  void *in_stack_ffffffffffffffc8;
  long *m;
  bign_deep_i in_stack_ffffffffffffffd8;
  word *b;
  size_t in_stack_ffffffffffffffe0;
  qr_o *r;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar4;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if (bVar1 == 0) {
    eVar4 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffff90);
    if (bVar1 == 0) {
      eVar4 = 0x1f6;
    }
    else {
      bignStart_keep(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      stack_00 = (long *)blobCreate((size_t)in_stack_ffffffffffffff88);
      if (stack_00 == (long *)0x0) {
        eVar4 = 0x6e;
      }
      else {
        eVar4 = bignStart(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        if (eVar4 == 0) {
          r = *(qr_o **)(stack_00[3] + 0x38);
          b = *(word **)(stack_00[3] + 0x30);
          dest = (u64 *)((long)stack_00 + *stack_00);
          a_00 = dest;
          m = stack_00;
          sVar3 = beltHash_keep();
          a = (word *)((long)dest + sVar3);
          stack_01 = (ec_o *)(a + 8);
          seed_00 = a;
          beltHashStart(dest);
          beltHashStepH(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,dest);
          beltHashStepH(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,dest);
          ec_00 = stack_01;
          a_01 = a_00;
          beltHash_keep();
          memCopy(dest,in_stack_ffffffffffffff88,0x15075d);
          beltHashStepH(a_00,(size_t)stack_01,dest);
          memCopy(dest,in_stack_ffffffffffffff88,0x150793);
          bignSeedInc((octet *)seed_00);
          beltHashStepH(a_00,(size_t)stack_01,dest);
          beltHashStepG((octet *)dest,in_stack_ffffffffffffff88);
          beltHashStepG((octet *)dest,in_stack_ffffffffffffff88);
          u64From(dest,in_stack_ffffffffffffff88,0x1507e7);
          zzMod(in_RDI,(word *)CONCAT44(eVar4,in_stack_ffffffffffffffe8),(size_t)r,b,(size_t)m,
                stack_00);
          u64To(dest,(size_t)in_stack_ffffffffffffff88,(u64 *)0x150826);
          iVar2 = (**(code **)(stack_00[3] + 0x40))(a,a,stack_00[3],ec_00);
          if (((((iVar2 == 0) || (bVar1 = wwEq(a,(word *)stack_00[5],(size_t)b), bVar1 == 0)) ||
               (bVar1 = wwIsZero((word *)stack_00[5],(size_t)b), bVar1 != 0)) ||
              ((bVar1 = ecpIsValid(ec_00,a_00), bVar1 == 0 ||
               (bVar1 = ecpIsSafeGroup(ec_00,(size_t)a_00,stack_01), bVar1 == 0)))) ||
             (iVar2 = zzJacobi(a_01,(size_t)seed_00,a,(size_t)ec_00,a_00), iVar2 != 1)) {
            eVar4 = 0x1f6;
          }
          else {
            wwCopy(a,*(word **)(stack_00[3] + 0x18),(size_t)b);
            zzAddW2(a,(size_t)b,1);
            wwShLo(a_00,(size_t)stack_01,(size_t)dest);
            qrPower(unaff_retaddr,
                    (word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                    CONCAT44(eVar4,in_stack_ffffffffffffffe8),r,b);
            bVar1 = wwEq(a,(word *)(stack_00[6] + (long)b * 8),(size_t)b);
            if ((bVar1 == 0) ||
               (bVar1 = ecHasOrderA(a,ec_00,a_00,(size_t)stack_01,dest), bVar1 == 0)) {
              eVar4 = 0x1f6;
            }
          }
          blobClose((blob_t)0x1509da);
        }
        else {
          blobClose((blob_t)0x150670);
        }
      }
    }
  }
  return eVar4;
}

Assistant:

err_t bignParamsVal(const bign_params* params)
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	octet* hash_state;		/* [beltHash_keep] состояние хэширования */
	octet* seed;			/* [8] копия seed */
	word* B;				/* [W_OF_B(512)] переменная B */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignParamsVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// раскладка состояния
	hash_state = objEnd(ec, octet);
	seed = hash_state + beltHash_keep();
	B = (word*)seed;
	stack = B + W_OF_B(512);
	// belt-hash(p..)
	beltHashStart(hash_state);
	beltHashStepH(params->p, no, hash_state);
	// belt-hash(..a..)
	beltHashStepH(params->a, no, hash_state);
	memCopy(stack, hash_state, beltHash_keep());
	// belt-hash(..seed)
	beltHashStepH(params->seed, 8, hash_state);
	// belt-hash(..seed + 1)
	memCopy(seed, params->seed, 8);
	bignSeedInc(seed);
	beltHashStepH(seed, 8, stack);
	// B <- belt-hash(p || a || seed) || belt-hash(p || a || seed + 1)
	beltHashStepG((octet*)B, hash_state);
	beltHashStepG((octet*)B + 32, stack);
	wwFrom(B, B, 64);
	// B <- B \mod p
	zzMod(B, B, W_OF_O(64), ec->f->mod, n, stack);
	wwTo(B, 64, B);
	// проверить условия алгоритма 6.1.4
	if (qrFrom(B, (octet*)B, ec->f, stack) &&
		wwEq(B, ec->B, n) &&
		!wwIsZero(ec->B, n) &&
		ecpIsValid(ec, stack) &&
		ecpIsSafeGroup(ec, 50, stack) &&
		zzJacobi(ec->B, n, ec->f->mod, n, stack) == 1)
	{
		// B <- b^{(p + 1) / 4} = \sqrt{b} mod p
		wwCopy(B, ec->f->mod, n);
		zzAddW2(B, n, 1);
		wwShLo(B, n, 2);
		qrPower(B, ec->B, B, n, ec->f, stack);
		// оставшиеся условия
		if (!wwEq(B, ecY(ec->base, n), n) ||
			!ecHasOrderA(ec->base, ec, ec->order, n, stack))
			code = ERR_BAD_PARAMS;
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}